

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator.cpp
# Opt level: O2

int bidfx_public_api::price::subject::SubjectComparatorUtils::Compare(Subject *a,Subject *b)

{
  int iVar1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)SubjectKey::SYMBOL_abi_cxx11_);
  Subject::GetComponent(&local_c0,a,&local_40);
  std::__cxx11::string::string((string *)&local_80,(string *)SubjectKey::SYMBOL_abi_cxx11_);
  Subject::GetComponent(&local_e0,b,&local_80);
  iVar1 = CompareStrings(&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  if (iVar1 == 0) {
    std::__cxx11::string::string((string *)&local_60,(string *)SubjectKey::QUANTITY_abi_cxx11_);
    Subject::GetComponent(&local_c0,a,&local_60);
    std::__cxx11::string::string((string *)&local_a0,(string *)SubjectKey::QUANTITY_abi_cxx11_);
    Subject::GetComponent(&local_e0,b,&local_a0);
    iVar1 = CompareQuantity(&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_60);
    if (iVar1 == 0) {
      iVar1 = Subject::Compare(a,b);
    }
  }
  return iVar1;
}

Assistant:

int SubjectComparatorUtils::Compare(const Subject& a, const Subject& b)
{
    int cmp = SubjectComparatorUtils::CompareStrings(a.GetComponent(SubjectKey::SYMBOL),
                                                     b.GetComponent(SubjectKey::SYMBOL));

    if (cmp == 0)
    {
        cmp = SubjectComparatorUtils::CompareQuantity(a.GetComponent(SubjectKey::QUANTITY),
                                                      b.GetComponent(SubjectKey::QUANTITY));
        if (cmp == 0)
        {
            return a.Compare(b);
        }
    }

    return cmp;
}